

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash.h
# Opt level: O0

void __thiscall
highwayhash::HighwayHashCatT<2U>::Finalize<unsigned_long[4]>
          (HighwayHashCatT<2U> *this,unsigned_long (*hash) [4])

{
  size_t buffer_usage;
  HHStateT<2U> state_copy;
  unsigned_long (*hash_local) [4];
  HighwayHashCatT<2U> *this_local;
  
  state_copy.mul1H.v_[1] = (longlong)hash;
  SSE41::HHStateSSE41::HHStateSSE41((HHStateSSE41 *)&buffer_usage,&this->state_);
  if (this->buffer_usage_ != 0) {
    SSE41::HHStateSSE41::UpdateRemainder
              ((HHStateSSE41 *)&buffer_usage,this->buffer_,this->buffer_usage_);
  }
  SSE41::HHStateSSE41::Finalize((HHStateSSE41 *)&buffer_usage,(HHResult256 *)state_copy.mul1H.v_[1])
  ;
  return;
}

Assistant:

HH_INLINE void Finalize(Result* HH_RESTRICT hash) const {
    // BeginIACA();
    HHStateT<Target> state_copy = state_;
    const size_t buffer_usage = buffer_usage_;
    if (HH_LIKELY(buffer_usage != 0)) {
      state_copy.UpdateRemainder(buffer_, buffer_usage);
    }
    state_copy.Finalize(hash);
    // EndIACA();
  }